

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_rela589n.cxx
# Opt level: O0

void newGenerationSort(int64_t **arr,int len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  uint uVar5;
  uint *puVar6;
  ulong uVar7;
  void *lenB;
  void *pvVar8;
  int64_t *piVar9;
  int64_t **a;
  int in_ESI;
  int iVar10;
  long *in_RDI;
  int part2Len;
  int64_t *part2;
  int64_t *copy;
  int selectionLen;
  int j_1;
  int j;
  int i_1;
  int restSecondLen;
  int restFirstLen;
  int64_t *restSecond;
  int64_t *restFirst;
  int restLen;
  int i;
  int right;
  int left;
  int64_t *selection;
  int localCatchUp;
  int64_t *in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int64_t *in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int iVar11;
  int local_24;
  int local_20;
  int local_1c;
  int64_t **ppiVar12;
  uint uVar13;
  
  puVar6 = (uint *)std::min<int>(&catchUp,(int *)&stack0xfffffffffffffff4);
  uVar5 = *puVar6;
  insertionSort(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  if ((int)uVar5 < in_ESI) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(in_ESI << 1);
    uVar7 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    lenB = operator_new__(uVar7);
    local_1c = in_ESI + -2;
    *(undefined8 *)((long)lenB + (long)(in_ESI + -1) * 8) = *(undefined8 *)*in_RDI;
    local_20 = in_ESI;
    for (local_24 = 1; local_24 < (int)uVar5; local_24 = local_24 + 1) {
      *(undefined8 *)((long)lenB + (long)local_20 * 8) =
           *(undefined8 *)(*in_RDI + (long)local_24 * 8);
      local_20 = local_20 + 1;
    }
    iVar4 = in_ESI >> 1;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)iVar4;
    uVar7 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pvVar8 = operator_new__(uVar7);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)iVar4;
    uVar7 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    piVar9 = (int64_t *)operator_new__(uVar7);
    iVar11 = 0;
    iVar4 = 0;
    uVar13 = uVar5;
    for (; (int)uVar5 < in_ESI; uVar5 = uVar5 + 1) {
      if (*(long *)(*in_RDI + (long)(int)uVar5 * 8) <
          *(long *)((long)lenB + (long)(int)(local_20 - uVar13) * 8)) {
        if (*(long *)((long)lenB + (long)(int)(local_1c + uVar13) * 8) <
            *(long *)(*in_RDI + (long)(int)uVar5 * 8)) {
          if ((uVar5 & 1) == 0) {
            iVar10 = iVar4 + 1;
            piVar9[iVar4] = *(int64_t *)(*in_RDI + (long)(int)uVar5 * 8);
          }
          else {
            *(undefined8 *)((long)pvVar8 + (long)iVar11 * 8) =
                 *(undefined8 *)(*in_RDI + (long)(int)uVar5 * 8);
            iVar10 = iVar4;
            iVar11 = iVar11 + 1;
          }
        }
        else {
          *(undefined8 *)((long)lenB + (long)local_1c * 8) =
               *(undefined8 *)(*in_RDI + (long)(int)uVar5 * 8);
          in_stack_ffffffffffffffb4 = local_1c;
          while (*(long *)((long)lenB + (long)(in_stack_ffffffffffffffb4 + 1) * 8) <=
                 *(long *)((long)lenB + (long)in_stack_ffffffffffffffb4 * 8)) {
            std::swap<long>((long *)((long)lenB + (long)in_stack_ffffffffffffffb4 * 8),
                            (long *)((long)lenB + (long)(in_stack_ffffffffffffffb4 + 1) * 8));
            in_stack_ffffffffffffffb4 = in_stack_ffffffffffffffb4 + 1;
          }
          local_1c = local_1c + -1;
          iVar10 = iVar4;
        }
      }
      else {
        *(undefined8 *)((long)lenB + (long)local_20 * 8) =
             *(undefined8 *)(*in_RDI + (long)(int)uVar5 * 8);
        in_stack_ffffffffffffffb8 = local_20;
        while (*(long *)((long)lenB + (long)in_stack_ffffffffffffffb8 * 8) <
               *(long *)((long)lenB + (long)(in_stack_ffffffffffffffb8 + -1) * 8)) {
          std::swap<long>((long *)((long)lenB + (long)(in_stack_ffffffffffffffb8 + -1) * 8),
                          (long *)((long)lenB + (long)in_stack_ffffffffffffffb8 * 8));
          in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + -1;
        }
        local_20 = local_20 + 1;
        iVar10 = iVar4;
      }
      iVar4 = iVar10;
    }
    safe_delete(in_stack_ffffffffffffff90);
    iVar10 = (local_20 - local_1c) + -1;
    a = (int64_t **)
        glue((int64_t *)CONCAT44(iVar11,iVar4),CONCAT44(uVar5,in_stack_ffffffffffffffb8),
             (int64_t *)CONCAT44(in_stack_ffffffffffffffb4,iVar10),in_stack_ffffffffffffffa8);
    if (lenB != (void *)0x0) {
      operator_delete__(lenB);
    }
    ppiVar12 = a;
    newGenerationSort((int64_t **)CONCAT44(in_ESI,uVar13),(int)((ulong)a >> 0x20));
    newGenerationSort((int64_t **)CONCAT44(in_ESI,uVar13),(int)((ulong)ppiVar12 >> 0x20));
    if (iVar10 < iVar11) {
      glueDelete((int64_t **)CONCAT44(in_stack_ffffffffffffffb4,iVar10),a,
                 (int64_t)in_stack_ffffffffffffffa0,
                 (int64_t **)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (int64_t)lenB);
      iVar10 = iVar11 + iVar10;
      in_stack_ffffffffffffffa0 = piVar9;
    }
    else {
      glueDelete((int64_t **)CONCAT44(in_stack_ffffffffffffffb4,iVar10),a,
                 (int64_t)in_stack_ffffffffffffffa0,
                 (int64_t **)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (int64_t)lenB);
      iVar4 = iVar11 + iVar4;
    }
    glueDelete((int64_t **)CONCAT44(in_stack_ffffffffffffffb4,iVar10),a,
               (int64_t)in_stack_ffffffffffffffa0,
               (int64_t **)CONCAT44(iVar4,in_stack_ffffffffffffff98),(int64_t)lenB);
  }
  return;
}

Assistant:

static void newGenerationSort(SORT_TYPE *&arr, int len) {
  int localCatchUp =
      min(catchUp, len); // потому что мы не можем пытаться вставлять элемент за
                         // границами массива
  insertionSort(arr, 0,
                localCatchUp -
                    1); // для начала сортируем первые localCatchUp элементов

  if (len <=
      localCatchUp) // на случай если это массив на n <= catchUp элементов
    return;         // а также это база рекурсии

  SORT_TYPE *selection =
      new SORT_TYPE[len << 1]; // то же что и new int[len * 2]
  int left = len - 1; // индекс для хранения новых минимальных элементов
  int right = len; // индекс для хранения новых максимальных элементов

  selection[left--] = arr[0];
  for (int i = 1; i < localCatchUp; ++i) {
    selection[right++] = arr[i];
  }

  int restLen = len >> 1;
  SORT_TYPE *restFirst = new SORT_TYPE[restLen];
  SORT_TYPE *restSecond = new SORT_TYPE[restLen];

  int restFirstLen = 0;
  int restSecondLen = 0;

  for (int i = localCatchUp; i < len; ++i) {

    if (selection[right - localCatchUp] <= arr[i]) {
      selection[right] = arr[i];

      for (int j = right; selection[j - 1] > selection[j]; --j)
        swap(selection[j - 1], selection[j]);

      ++right;
      continue;
    }

    if (selection[left + localCatchUp] >= arr[i]) {
      selection[left] = arr[i];

      for (int j = left; selection[j] >= selection[j + 1]; ++j)
        swap(selection[j], selection[j + 1]);

      --left;
      continue;
    }

    if (i & 1) { // i - непарное
      restFirst[restFirstLen++] = arr[i];
    } else {
      restSecond[restSecondLen++] = arr[i];
    }
  }
  safe_delete(arr);

  int selectionLen = right - left - 1; // просто длина нашей выборки
  SORT_TYPE *copy = glue(selection + left + 1, selectionLen, nullptr,
                         0); // копируем все элементы выборки в новый массив

  delete[] selection; // удаляем массив размером 2 * len элементов и
  selection =
      copy; // вместо него используем ровно столько памяти, сколько нужно

  newGenerationSort(restFirst, restFirstLen);
  newGenerationSort(restSecond, restSecondLen);

  SORT_TYPE *part2;
  int part2Len;
  if (selectionLen < restFirstLen) {
    glueDelete(selection, restFirst, restFirstLen, selection,
               selectionLen); // selection += restFirst
    selectionLen += restFirstLen;

    part2 = restSecond;
    part2Len = restSecondLen;
  } else {
    glueDelete(part2, restFirst, restFirstLen, restSecond,
               restSecondLen); // part2 = restFirst + restSecond
    part2Len = restFirstLen + restSecondLen;
  }

  glueDelete(arr, selection, selectionLen, part2, part2Len);
}